

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

void __thiscall
jpgd::jpeg_decoder::decode_scan(jpeg_decoder *this,pDecode_block_func decode_block_func)

{
  int iVar1;
  code *in_RSI;
  jpeg_decoder *in_RDI;
  int block_y_mcu_ofs;
  int block_x_mcu_ofs;
  int component_id;
  int component_num;
  int block_y_mcu [4];
  int block_x_mcu [4];
  int mcu_block;
  int mcu_col;
  int mcu_row;
  int local_58;
  int local_54;
  int local_4c;
  int local_48 [4];
  int local_38 [7];
  int local_1c;
  int local_18;
  int local_14;
  code *local_10;
  
  local_10 = in_RSI;
  memset(local_48,0,0x10);
  for (local_18 = 0; local_18 < in_RDI->m_mcus_per_col; local_18 = local_18 + 1) {
    memset(local_38,0,0x10);
    for (local_14 = 0; local_14 < in_RDI->m_mcus_per_row; local_14 = local_14 + 1) {
      local_54 = 0;
      local_58 = 0;
      if ((in_RDI->m_restart_interval != 0) && (in_RDI->m_restarts_left == 0)) {
        process_restart(in_RDI);
      }
      for (local_1c = 0; local_1c < in_RDI->m_blocks_per_mcu; local_1c = local_1c + 1) {
        iVar1 = in_RDI->m_mcu_org[local_1c];
        (*local_10)(in_RDI,iVar1,local_38[iVar1] + local_54,local_48[iVar1] + local_58);
        if (in_RDI->m_comps_in_scan == 1) {
          local_38[iVar1] = local_38[iVar1] + 1;
        }
        else {
          local_54 = local_54 + 1;
          if (local_54 == in_RDI->m_comp_h_samp[iVar1]) {
            local_54 = 0;
            local_58 = local_58 + 1;
            if (local_58 == in_RDI->m_comp_v_samp[iVar1]) {
              local_58 = 0;
              local_38[iVar1] = in_RDI->m_comp_h_samp[iVar1] + local_38[iVar1];
            }
          }
        }
      }
      in_RDI->m_restarts_left = in_RDI->m_restarts_left + -1;
    }
    if (in_RDI->m_comps_in_scan == 1) {
      local_48[in_RDI->m_comp_list[0]] = local_48[in_RDI->m_comp_list[0]] + 1;
    }
    else {
      for (local_4c = 0; local_4c < in_RDI->m_comps_in_scan; local_4c = local_4c + 1) {
        iVar1 = in_RDI->m_comp_list[local_4c];
        local_48[iVar1] = in_RDI->m_comp_v_samp[iVar1] + local_48[iVar1];
      }
    }
  }
  return;
}

Assistant:

void jpeg_decoder::decode_scan(pDecode_block_func decode_block_func)
	{
		int mcu_row, mcu_col, mcu_block;
		int block_x_mcu[JPGD_MAX_COMPONENTS], block_y_mcu[JPGD_MAX_COMPONENTS];

		memset(block_y_mcu, 0, sizeof(block_y_mcu));

		for (mcu_col = 0; mcu_col < m_mcus_per_col; mcu_col++)
		{
			int component_num, component_id;

			memset(block_x_mcu, 0, sizeof(block_x_mcu));

			for (mcu_row = 0; mcu_row < m_mcus_per_row; mcu_row++)
			{
				int block_x_mcu_ofs = 0, block_y_mcu_ofs = 0;

				if ((m_restart_interval) && (m_restarts_left == 0))
					process_restart();

				for (mcu_block = 0; mcu_block < m_blocks_per_mcu; mcu_block++)
				{
					component_id = m_mcu_org[mcu_block];

					decode_block_func(this, component_id, block_x_mcu[component_id] + block_x_mcu_ofs, block_y_mcu[component_id] + block_y_mcu_ofs);

					if (m_comps_in_scan == 1)
						block_x_mcu[component_id]++;
					else
					{
						if (++block_x_mcu_ofs == m_comp_h_samp[component_id])
						{
							block_x_mcu_ofs = 0;

							if (++block_y_mcu_ofs == m_comp_v_samp[component_id])
							{
								block_y_mcu_ofs = 0;
								block_x_mcu[component_id] += m_comp_h_samp[component_id];
							}
						}
					}
				}

				m_restarts_left--;
			}

			if (m_comps_in_scan == 1)
				block_y_mcu[m_comp_list[0]]++;
			else
			{
				for (component_num = 0; component_num < m_comps_in_scan; component_num++)
				{
					component_id = m_comp_list[component_num];
					block_y_mcu[component_id] += m_comp_v_samp[component_id];
				}
			}
		}
	}